

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

Expression * __thiscall
soul::StructuralParser::parseType(StructuralParser *this,ParseTypeContext parseContext)

{
  Expression *pEVar1;
  pool_ptr<soul::AST::Expression> type;
  undefined1 local_50 [64];
  
  tryParsingType((StructuralParser *)local_50,(ParseTypeContext)this);
  if ((Expression *)local_50._0_8_ == (Expression *)0x0) {
    Errors::expectedType<>();
    (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,local_50 + 8);
    CompileMessage::~CompileMessage((CompileMessage *)(local_50 + 8));
  }
  pEVar1 = pool_ptr<soul::AST::Expression>::operator*((pool_ptr<soul::AST::Expression> *)local_50);
  return pEVar1;
}

Assistant:

AST::Expression& parseType (ParseTypeContext parseContext)
    {
        auto type = tryParsingType (parseContext);

        if (type == nullptr)
            throwError (Errors::expectedType());

        return *type;
    }